

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

BigPropertyIndex __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::GetPropertyIndex_EnumerateTTD
          (DictionaryTypeHandlerBase<unsigned_short> *this,PropertyRecord *pRecord)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long in_RAX;
  PropertyRecord **ppPVar4;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar5;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  uint index;
  undefined8 uStack_38;
  
  uStack_38._4_4_ = (BigPropertyIndex)((ulong)in_RAX >> 0x20);
  this_00 = (this->propertyMap).ptr;
  iVar3 = this_00->count - this_00->freeCount;
  bVar1 = 0 < iVar3;
  if (0 < iVar3) {
    index = 0;
    uStack_38 = in_RAX;
    do {
      ppPVar4 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetKeyAt(this_00,index);
      iVar3 = (*ppPVar4)->pid;
      pDVar5 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetValueAt((this->propertyMap).ptr,index);
      if ((iVar3 == pRecord->pid) && ((pDVar5->Attributes & 8) == 0)) {
        bVar2 = false;
        uStack_38 = (ulong)index << 0x20;
      }
      else {
        bVar2 = true;
      }
      if (!bVar2) break;
      index = index + 1;
      this_00 = (this->propertyMap).ptr;
      iVar3 = this_00->count - this_00->freeCount;
      bVar1 = (int)index < iVar3;
    } while ((int)index < iVar3);
  }
  if (!bVar1) {
    TTDAbort_unrecoverable_error("We found this and not accessor but NoBigSlot for index?");
  }
  return uStack_38._4_4_;
}

Assistant:

Js::BigPropertyIndex DictionaryTypeHandlerBase<T>::GetPropertyIndex_EnumerateTTD(const Js::PropertyRecord* pRecord)
    {
        for (Js::BigPropertyIndex index = 0; index < this->propertyMap->Count(); index++)
        {
            Js::PropertyId pid = this->propertyMap->GetKeyAt(index)->GetPropertyId();
            const DictionaryPropertyDescriptor<T>& idescriptor = propertyMap->GetValueAt(index);

            if (pid == pRecord->GetPropertyId() && !(idescriptor.Attributes & PropertyDeleted))
            {
                return index;
            }
        }

        TTDAssert(false, "We found this and not accessor but NoBigSlot for index?");
        return Js::Constants::NoBigSlot;
    }